

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<CTestResource_Test2DTileXResourceArrays_Test>::CreateTest
          (TestFactoryImpl<CTestResource_Test2DTileXResourceArrays_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  if (this_00 == (Test *)0x0) {
    this_00 = (Test *)0x0;
  }
  else {
    Test::Test(this_00);
    this_00->_vptr_Test = (_func_int **)&PTR__CTestResource_001d9810;
  }
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }